

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  DecodeStatus DVar4;
  void *pvVar5;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t uVar6;
  uint64_t extraout_RDX_00;
  uint64_t Address_01;
  uint64_t extraout_RDX_01;
  uint64_t extraout_RDX_02;
  uint64_t extraout_RDX_03;
  uint64_t extraout_RDX_04;
  uint uVar7;
  
  uVar7 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  pvVar5 = (void *)(ulong)(uVar2 - 0x391);
  if (uVar2 - 0x391 < 0xc) {
LAB_00152b2e:
    DVar3 = DecodeDPairRegisterClass(Inst,uVar7,Address_00,pvVar5);
  }
  else {
    pvVar5 = (void *)(ulong)(uVar2 - 0x3d2);
    if (uVar2 - 0x3d2 < 9) {
      DVar3 = DecodeDPairSpacedRegisterClass(Inst,uVar7,Address_00,pvVar5);
    }
    else {
      if (uVar2 - 0x3db < 9) goto LAB_00152b2e;
      DVar3 = DecodeDPRRegisterClass(Inst,uVar7,Address_00,pvVar5);
    }
  }
  if ((DVar3 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar2 = MCInst_getOpcode(Inst);
  pvVar5 = (void *)(ulong)(uVar2 - 0x43d);
  uVar6 = extraout_RDX;
  if (uVar2 - 0x43d < 0x22) {
    uVar6 = 0x999;
    if ((0x999UL >> ((ulong)pvVar5 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)pvVar5 & 0x3f) & 1) == 0) goto LAB_00152b87;
LAB_00152ba2:
      uVar2 = uVar7 + 2;
    }
    else {
LAB_00152ba8:
      uVar2 = uVar7 + 1;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar2 & 0x1f,uVar6,pvVar5);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
  }
  else {
LAB_00152b87:
    uVar2 = uVar2 - 0x4b1;
    if (uVar2 < 0x22) {
      pvVar5 = (void *)0x999;
      if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00152ba8;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00152ba2;
    }
  }
  uVar2 = MCInst_getOpcode(Inst);
  pvVar5 = (void *)(ulong)(uVar2 - 0x43d);
  uVar6 = extraout_RDX_00;
  if (uVar2 - 0x43d < 0x22) {
    uVar6 = 0x999;
    if ((0x999UL >> ((ulong)pvVar5 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)pvVar5 & 0x3f) & 1) == 0) goto LAB_00152bec;
LAB_00152c07:
      uVar2 = uVar7 + 4;
    }
    else {
LAB_00152c0d:
      uVar2 = uVar7 + 2;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar2 & 0x1f,uVar6,pvVar5);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
  }
  else {
LAB_00152bec:
    uVar2 = uVar2 - 0x4b1;
    if (uVar2 < 0x22) {
      pvVar5 = (void *)0x999;
      if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00152c0d;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_00152c07;
    }
  }
  uVar2 = MCInst_getOpcode(Inst);
  uVar2 = uVar2 - 0x4b1;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00152c7c;
      uVar7 = uVar7 + 6;
    }
    else {
      uVar7 = uVar7 + 3;
    }
    DVar4 = DecodeDPRRegisterClass(Inst,uVar7 & 0x1f,Address_01,(void *)0x999);
    if (DVar4 != MCDisassembler_Success) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
  }
LAB_00152c7c:
  uVar7 = Insn >> 0x10 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  pvVar5 = (void *)(ulong)(uVar2 - 0x369);
  uVar6 = extraout_RDX_01;
  if (((uVar2 - 0x369 < 0x34) &&
      (uVar6 = 0xdb6f67860f67b, (0xdb6f67860f67bU >> ((ulong)pvVar5 & 0x3f) & 1) != 0)) ||
     ((pvVar5 = (void *)(ulong)(uVar2 - 0x3d3), uVar2 - 0x3d3 < 0x23 &&
      (uVar6 = 0x61861b6db, (0x61861b6dbU >> ((ulong)pvVar5 & 0x3f) & 1) != 0)))) {
    MCOperand_CreateImm0(Inst,0);
    uVar6 = extraout_RDX_02;
  }
  else {
    uVar1 = uVar2 - 0x440;
    pvVar5 = (void *)(ulong)uVar1;
    if ((((uVar1 < 0x1f) && (uVar6 = 0x42100111, (0x42100111U >> (uVar1 & 0x1f) & 1) != 0)) ||
        ((uVar2 - 0x4b4 < 0x1f &&
         (pvVar5 = (void *)0x42100111, (0x42100111U >> (uVar2 - 0x4b4 & 0x1f) & 1) != 0)))) &&
       (DVar4 = DecodeGPRRegisterClass(Inst,uVar7,uVar6,pvVar5), uVar6 = extraout_RDX_04,
       DVar4 != MCDisassembler_Success)) {
      if (DVar4 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
  }
  DVar4 = DecodeAddrMode6Operand(Inst,uVar7 | Insn & 0x30,uVar6,pvVar5);
  if (DVar4 != MCDisassembler_Success) {
    if (DVar4 != MCDisassembler_SoftFail) {
      return MCDisassembler_Fail;
    }
    DVar3 = MCDisassembler_SoftFail;
  }
  uVar2 = MCInst_getOpcode(Inst);
  pvVar5 = (void *)(ulong)(uVar2 - 0x369);
  uVar6 = extraout_RDX_03;
  if ((0x33 < uVar2 - 0x369) ||
     (uVar6 = 0xdb6d26820d269, (0xdb6d26820d269U >> ((ulong)pvVar5 & 0x3f) & 1) == 0)) {
    if ((uVar2 - 0x3d3 < 0x22) &&
       (pvVar5 = (void *)0x208209249, (0x208209249U >> ((ulong)(uVar2 - 0x3d3) & 0x3f) & 1) != 0)) {
      return DVar3;
    }
    if ((Insn & 0xf) == 0xd) {
      MCOperand_CreateReg0(Inst,0);
      return DVar3;
    }
  }
  if ((((~Insn & 0xd) != 0) &&
      (DVar4 = DecodeGPRRegisterClass(Inst,Insn & 0xf,uVar6,pvVar5), DVar4 != MCDisassembler_Success
      )) && (DVar3 = MCDisassembler_Fail, DVar4 == MCDisassembler_SoftFail)) {
    DVar3 = MCDisassembler_SoftFail;
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeVLDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// First output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1q16: case ARM_VLD1q32: case ARM_VLD1q64: case ARM_VLD1q8:
		case ARM_VLD1q16wb_fixed: case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_fixed: case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_fixed: case ARM_VLD1q64wb_register:
		case ARM_VLD1q8wb_fixed: case ARM_VLD1q8wb_register:
		case ARM_VLD2d16: case ARM_VLD2d32: case ARM_VLD2d8:
		case ARM_VLD2d16wb_fixed: case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_fixed: case ARM_VLD2d32wb_register:
		case ARM_VLD2d8wb_fixed: case ARM_VLD2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2b16:
		case ARM_VLD2b32:
		case ARM_VLD2b8:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
		default:
			break;
	}

	// Third output register
	switch(MCInst_getOpcode(Inst)) {
		case ARM_VLD3d8:
		case ARM_VLD3d16:
		case ARM_VLD3d32:
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD3q8:
		case ARM_VLD3q16:
		case ARM_VLD3q32:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth output register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD4d8:
		case ARM_VLD4d16:
		case ARM_VLD4d32:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD4q8:
		case ARM_VLD4q16:
		case ARM_VLD4q32:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Writeback operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d8Twb_register:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d16Twb_register:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d32Twb_register:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d64Twb_register:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d8Qwb_register:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d16Qwb_register:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d32Qwb_register:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d64Qwb_register:
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
		case ARM_VLD2d8wb_register:
		case ARM_VLD2d16wb_register:
		case ARM_VLD2d32wb_register:
		case ARM_VLD2q8wb_register:
		case ARM_VLD2q16wb_register:
		case ARM_VLD2q32wb_register:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2b8wb_register:
		case ARM_VLD2b16wb_register:
		case ARM_VLD2b32wb_register:
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VLD3d8_UPD:
		case ARM_VLD3d16_UPD:
		case ARM_VLD3d32_UPD:
		case ARM_VLD3q8_UPD:
		case ARM_VLD3q16_UPD:
		case ARM_VLD3q32_UPD:
		case ARM_VLD4d8_UPD:
		case ARM_VLD4d16_UPD:
		case ARM_VLD4d32_UPD:
		case ARM_VLD4q8_UPD:
		case ARM_VLD4q16_UPD:
		case ARM_VLD4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			// The below have been updated to have explicit am6offset split
			// between fixed and register offset. For those instructions not
			// yet updated, we need to add an additional reg0 operand for the
			// fixed variant.
			//
			// The fixed offset encodes as Rm == 0xd, so we check for that.
			if (Rm == 0xd) {
				MCOperand_CreateReg0(Inst, 0);
				break;
			}
			// Fall through to handle the register offset variant.
		case ARM_VLD1d8wb_fixed:
		case ARM_VLD1d16wb_fixed:
		case ARM_VLD1d32wb_fixed:
		case ARM_VLD1d64wb_fixed:
		case ARM_VLD1d8Twb_fixed:
		case ARM_VLD1d16Twb_fixed:
		case ARM_VLD1d32Twb_fixed:
		case ARM_VLD1d64Twb_fixed:
		case ARM_VLD1d8Qwb_fixed:
		case ARM_VLD1d16Qwb_fixed:
		case ARM_VLD1d32Qwb_fixed:
		case ARM_VLD1d64Qwb_fixed:
		case ARM_VLD1d8wb_register:
		case ARM_VLD1d16wb_register:
		case ARM_VLD1d32wb_register:
		case ARM_VLD1d64wb_register:
		case ARM_VLD1q8wb_fixed:
		case ARM_VLD1q16wb_fixed:
		case ARM_VLD1q32wb_fixed:
		case ARM_VLD1q64wb_fixed:
		case ARM_VLD1q8wb_register:
		case ARM_VLD1q16wb_register:
		case ARM_VLD1q32wb_register:
		case ARM_VLD1q64wb_register:
			// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
			// variant encodes Rm == 0xf. Anything else is a register offset post-
			// increment and we need to add the register operand to the instruction.
			if (Rm != 0xD && Rm != 0xF &&
					!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2d8wb_fixed:
		case ARM_VLD2d16wb_fixed:
		case ARM_VLD2d32wb_fixed:
		case ARM_VLD2b8wb_fixed:
		case ARM_VLD2b16wb_fixed:
		case ARM_VLD2b32wb_fixed:
		case ARM_VLD2q8wb_fixed:
		case ARM_VLD2q16wb_fixed:
		case ARM_VLD2q32wb_fixed:
			break;
	}

	return S;
}